

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

CoverCrossSyntax * __thiscall
slang::parsing::Parser::parseCoverCross(Parser *this,AttrList attributes,NamedLabelSyntax *label)

{
  SyntaxFactory *this_00;
  SyntaxNode *pSVar1;
  Token openBrace;
  Token openBrace_00;
  Token closeBrace_00;
  Token closeBrace_01;
  Token emptySemi;
  bool bVar2;
  int iVar3;
  int iVar4;
  IdentifierNameSyntax *pIVar5;
  SourceLocation SVar6;
  CoverageIffClauseSyntax *iff;
  Diagnostic *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CoverCrossSyntax *pCVar7;
  undefined4 extraout_var_01;
  __extent_storage<18446744073709551615UL> _Var8;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src_00;
  byte bVar9;
  byte bVar10;
  Token cross;
  Token TVar11;
  SourceRange range;
  string_view arg;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  MemberSyntax *member;
  Token closeBrace;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_268;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_230;
  ulong local_220;
  char acStack_218 [8];
  size_t local_210;
  pointer local_208;
  size_t local_200;
  SyntaxList<slang::syntax::MemberSyntax> local_1d8;
  Token *local_1a0;
  Token *local_198;
  CoverageIffClauseSyntax *local_190;
  Info *local_188;
  undefined8 local_180;
  Token local_178;
  Token local_168;
  undefined8 local_158;
  Info *pIStack_150;
  Token local_148;
  Token local_138;
  Token local_128;
  Token local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  _Var8 = attributes._M_extent._M_extent_value;
  cross = ParserBase::expect(&this->super_ParserBase,CrossKeyword);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  this_00 = &this->factory;
  do {
    TVar11 = ParserBase::expect(&this->super_ParserBase,Identifier);
    pIVar5 = slang::syntax::SyntaxFactory::identifierName(this_00,TVar11);
    local_230._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pIVar5;
    local_220 = CONCAT71(local_220._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_108,(TokenOrSyntax *)&local_230._M_first);
    bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (!bVar2) break;
    local_230._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_220 = local_220 & 0xffffffffffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_108,(TokenOrSyntax *)&local_230._M_first);
  } while (bVar2);
  if (local_108[0].len < 2) {
    local_230._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::peek(&this->super_ParserBase);
    SVar6 = Token::location(&local_230._M_first._M_storage);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x120005,SVar6);
  }
  iff = parseCoverageIffClause(this);
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  local_210 = _Var8._M_extent_value;
  local_208 = attributes._M_ptr;
  local_200 = _Var8._M_extent_value;
  if (bVar2) {
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    local_188 = TVar11.info;
    local_180 = TVar11._0_8_;
    local_190 = iff;
    Token::Token(&local_178);
    local_230._M_first._M_storage.info = (Info *)0x0;
    local_230._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)acStack_218;
    local_220 = 8;
    local_198 = &(this->super_ParserBase).lastPoppedDelims.first;
    local_1a0 = &(this->super_ParserBase).lastPoppedDelims.second;
    bVar9 = 0;
    do {
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      bVar2 = false;
      if ((TVar11.kind != EndOfFile) && ((TVar11._0_4_ & 0xffff) != 0xe)) {
        local_1d8.super_SyntaxListBase._vptr_SyntaxListBase =
             (_func_int **)parseCoverCrossMember(this);
        if ((MemberSyntax *)local_1d8.super_SyntaxListBase._vptr_SyntaxListBase ==
            (MemberSyntax *)0x0) {
          bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar11.kind);
          if (bVar2) {
            local_268.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            range = Token::range((Token *)&local_268);
            this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
            local_268.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            arg = Token::valueText((Token *)&local_268);
            Diagnostic::operator<<(this_01,arg);
            bVar9 = 1;
            if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
               ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
              SVar6 = Token::location(local_198);
              Diagnostic::addNote(this_01,(DiagCode)0xc10005,SVar6);
              SVar6 = Token::location(local_1a0);
              Diagnostic::addNote(this_01,(DiagCode)0xc00005,SVar6);
            }
          }
          bVar10 = ~bVar9;
          bVar9 = 1;
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)(bVar10 & 1) << 0x20 | 0x450005));
        }
        else {
          SmallVectorBase<slang::syntax::MemberSyntax*>::
          emplace_back<slang::syntax::MemberSyntax*const&>
                    ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_230._M_first,
                     (MemberSyntax **)&local_1d8);
          pSVar1 = this->previewNode;
          this->previewNode = (SyntaxNode *)0x0;
          ((SyntaxNode *)local_1d8.super_SyntaxListBase._vptr_SyntaxListBase)->previewNode = pSVar1;
          bVar9 = 0;
        }
        bVar2 = true;
      }
    } while (bVar2);
    local_178 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                      ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_230._M_first,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_178.info
                      );
    src_00 = extraout_RDX;
    if (local_230._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)acStack_218) {
      operator_delete((void *)local_230._M_rest);
      src_00 = extraout_RDX_00;
    }
    local_230._8_4_ = 1;
    local_220 = 0;
    acStack_218[0] = '\0';
    acStack_218[1] = '\0';
    acStack_218[2] = '\0';
    acStack_218[3] = '\0';
    acStack_218[4] = '\0';
    acStack_218[5] = '\0';
    acStack_218[6] = '\0';
    acStack_218[7] = '\0';
    local_230._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d2768;
    iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
    TVar11 = local_178;
    local_268.elements._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar4);
    local_268.super_SyntaxListBase.super_SyntaxNode.kind = 3;
    local_268.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5b10;
    local_158 = local_180;
    pIStack_150 = local_188;
    local_1d8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_1d8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_1d8.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_1d8.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5388;
    local_148.kind = local_178.kind;
    local_148._2_1_ = local_178._2_1_;
    local_148.numFlags.raw = local_178.numFlags.raw;
    local_148.rawLen = local_178.rawLen;
    local_148.info = local_178.info;
    local_1d8.super_SyntaxListBase.childCount = (size_t)extraout_RDX;
    local_1d8.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)CONCAT44(extraout_var,iVar3);
    local_1d8.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)extraout_RDX;
    local_178 = TVar11;
    Token::Token(&local_118);
    openBrace.info = pIStack_150;
    openBrace.kind = (undefined2)local_158;
    openBrace._2_1_ = local_158._2_1_;
    openBrace.numFlags.raw = local_158._3_1_;
    openBrace.rawLen = local_158._4_4_;
    closeBrace_00.info = local_148.info;
    closeBrace_00.kind = local_148.kind;
    closeBrace_00._2_1_ = local_148._2_1_;
    closeBrace_00.numFlags.raw = local_148.numFlags.raw;
    closeBrace_00.rawLen = local_148.rawLen;
    emptySemi.info = local_118.info;
    emptySemi.kind = local_118.kind;
    emptySemi._2_1_ = local_118._2_1_;
    emptySemi.numFlags.raw = local_118.numFlags.raw;
    emptySemi.rawLen = local_118.rawLen;
    pCVar7 = slang::syntax::SyntaxFactory::coverCross
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                &local_230._M_first,label,cross,&local_268,local_190,openBrace,
                        &local_1d8,closeBrace_00,emptySemi);
  }
  else {
    local_230._8_4_ = 1;
    local_220 = 0;
    acStack_218[0] = '\0';
    acStack_218[1] = '\0';
    acStack_218[2] = '\0';
    acStack_218[3] = '\0';
    acStack_218[4] = '\0';
    acStack_218[5] = '\0';
    acStack_218[6] = '\0';
    acStack_218[7] = '\0';
    local_230._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d2768;
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    local_268.elements._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar3);
    local_268.super_SyntaxListBase.super_SyntaxNode.kind = 3;
    local_268.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5b10;
    Token::Token(&local_128);
    local_1d8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_1d8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_1d8.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_1d8.super_SyntaxListBase.childCount = 0;
    local_1d8.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_1d8.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_1d8.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5388;
    Token::Token(&local_138);
    local_168 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    openBrace_00.info = local_128.info;
    openBrace_00.kind = local_128.kind;
    openBrace_00._2_1_ = local_128._2_1_;
    openBrace_00.numFlags.raw = local_128.numFlags.raw;
    openBrace_00.rawLen = local_128.rawLen;
    closeBrace_01.info = local_138.info;
    closeBrace_01.kind = local_138.kind;
    closeBrace_01._2_1_ = local_138._2_1_;
    closeBrace_01.numFlags.raw = local_138.numFlags.raw;
    closeBrace_01.rawLen = local_138.rawLen;
    pCVar7 = slang::syntax::SyntaxFactory::coverCross
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                &local_230._M_first,label,cross,&local_268,iff,openBrace_00,
                        &local_1d8,closeBrace_01,local_168);
  }
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pCVar7;
}

Assistant:

CoverCrossSyntax* Parser::parseCoverCross(AttrList attributes, NamedLabelSyntax* label) {
    auto keyword = expect(TokenKind::CrossKeyword);

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        buffer.push_back(&factory.identifierName(name));
        if (!peek(TokenKind::Comma))
            break;

        buffer.push_back(consume());
    }

    if (buffer.size() < 2)
        addDiag(diag::CoverCrossItems, peek().location());

    auto iff = parseCoverageIffClause();

    if (peek(TokenKind::OpenBrace)) {
        auto openBrace = consume();

        Token closeBrace;
        auto members = parseMemberList<MemberSyntax>(
            TokenKind::CloseBrace, closeBrace, SyntaxKind::CoverCross,
            [this](SyntaxKind, bool&) { return parseCoverCrossMember(); });

        return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, openBrace,
                                   members, closeBrace, Token());
    }

    // no brace, so this is an empty list, expect a semicolon
    return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, Token(),
                               nullptr, Token(), expect(TokenKind::Semicolon));
}